

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void icetDestroyContext(IceTContext context)

{
  IceTContext pIVar1;
  IceTContext context_00;
  IceTVoid *void_dtor_pointer;
  code *local_20;
  
  pIVar1 = icet_current_context;
  icetSetContext(context);
  icetGetPointerv(0x61,&local_20);
  if (local_20 != (code *)0x0) {
    (*local_20)();
  }
  context_00 = (IceTContext)0x0;
  if (pIVar1 != context) {
    context_00 = pIVar1;
  }
  context->magic_number = 0;
  icetStateDestroy(context->state);
  context->state = (IceTState)0x0;
  (*context->communicator->Destroy)(context->communicator);
  icetSetContext(context_00);
  free(context);
  return;
}

Assistant:

void icetDestroyContext(IceTContext context)
{
    IceTContext saved_current_context;

    saved_current_context = icetGetContext();
    if (context == saved_current_context) {
        icetRaiseDebug("Destroying current context.");
        saved_current_context = NULL;
    }

  /* Temporarily make the context to be destroyed current. */
    icetSetContext(context);

  /* Call destructors for other dependent units. */
    callDestructor(ICET_RENDER_LAYER_DESTRUCTOR);

  /* From here on out be careful.  We are invalidating the context. */
    context->magic_number = 0;

    icetStateDestroy(context->state);
    context->state = NULL;

    context->communicator->Destroy(context->communicator);

  /* The context is now completely destroyed and now null.  Restore saved
     context. */
    icetSetContext(saved_current_context);

    free(context);
}